

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O3

resource loader::anon_unknown_0::pe_reader::find_resource
                   (istream *is,uint32_t name,uint32_t type,uint32_t language)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  resource rVar5;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  value_type *__val;
  ulong uVar14;
  int iVar15;
  uint *puVar16;
  char buffer [2];
  size_type __len;
  uint local_54;
  ulong local_50;
  ulong local_48;
  uint local_40;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  resource rVar6;
  resource rVar7;
  resource rVar8;
  resource rVar9;
  resource rVar10;
  
  local_34 = language;
  std::istream::seekg((long)is,_S_end);
  std::istream::read((char *)is,(long)&local_54);
  uVar14 = (ulong)(ushort)local_54;
  std::istream::seekg((long)is,0xc);
  std::istream::read((char *)is,(long)&local_54);
  uVar13 = (ulong)(ushort)local_54;
  std::istream::seekg((long)is,_S_end);
  lVar4 = std::istream::tellg();
  std::istream::read((char *)is,(long)&local_54);
  if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
    local_50 = uVar13;
    local_48 = uVar14;
    local_3c = name;
    local_38 = type;
    std::istream::seekg((long)is,(uint)((ushort)local_54 == 0x20b) * 0x10 + 0x5a);
    std::istream::read((char *)is,(long)&local_54);
    uVar14 = local_48;
    if (local_54 < 3) {
      rVar9.offset = 0;
      rVar9.size = 0;
      return rVar9;
    }
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0) {
      rVar8.offset = 0;
      rVar8.size = 0;
      return rVar8;
    }
    std::istream::seekg((long)is,0x10);
    std::istream::read((char *)is,(long)&local_54);
    uVar12 = local_54;
    std::istream::read((char *)is,(long)&local_54);
    if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
      local_40 = uVar12;
      if (uVar12 == 0) {
        rVar7.offset = 0;
        rVar7.size = 0;
        return rVar7;
      }
      if (local_54 == 0) {
        rVar6.offset = 0;
        rVar6.size = 0;
        return rVar6;
      }
      std::istream::seekg(is,lVar4 + local_50 & 0xffffffff,0);
      if (uVar14 == 0) {
        rVar5.offset = 0;
        rVar5.size = 0;
        return rVar5;
      }
      local_50 = (ulong)(uint)((int)uVar14 * 4) * 3;
      puVar11 = (uint *)operator_new(local_50);
      puVar11[0] = 0;
      puVar11[1] = 0;
      puVar11[2] = 0;
      if (uVar14 != 1) {
        lVar4 = 0xc;
        do {
          *(uint *)((long)puVar11 + lVar4 + 8) = puVar11[2];
          *(undefined8 *)((long)puVar11 + lVar4) = *(undefined8 *)puVar11;
          lVar4 = lVar4 + 0xc;
        } while ((ulong)(uint)((int)local_48 * 4) * 3 != lVar4);
      }
      lVar4 = local_48 * 3;
      puVar16 = puVar11;
      do {
        std::istream::seekg((long)is,8);
        std::istream::read((char *)is,(long)&local_54);
        *puVar16 = local_54;
        std::istream::read((char *)is,(long)&local_54);
        puVar16[1] = local_54;
        std::istream::seekg((long)is,4);
        std::istream::read((char *)is,(long)&local_54);
        puVar16[2] = local_54;
        std::istream::seekg((long)is,0x10);
        puVar16 = puVar16 + 3;
      } while (puVar16 != puVar11 + lVar4);
      if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
        lVar4 = 0;
        do {
          uVar12 = *(uint *)((long)puVar11 + lVar4 + 4);
          if ((uVar12 <= local_40) && (local_40 < uVar12 + *(int *)((long)puVar11 + lVar4))) {
            iVar15 = (local_40 - uVar12) + *(int *)((long)puVar11 + lVar4 + 8);
            if (iVar15 != 0) {
              std::istream::seekg(is,iVar15,0);
              uVar2 = find_resource_entry(is,local_38);
              uVar3 = local_34;
              if ((int)uVar2 < 0) {
                std::istream::seekg(is,(uVar2 & 0x7fffffff) + iVar15,0);
                uVar2 = find_resource_entry(is,local_3c);
                if ((int)uVar2 < 0) {
                  std::istream::seekg(is,(uVar2 & 0x7fffffff) + iVar15,0);
                  uVar3 = find_resource_entry(is,uVar3);
                  if (0 < (int)uVar3) {
                    std::istream::seekg(is,uVar3 + iVar15,0);
                    std::istream::read((char *)is,(long)&local_54);
                    uVar12 = local_54;
                    std::istream::read((char *)is,(long)&local_54);
                    if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
                      uVar14 = 0;
                      lVar4 = 0;
                      goto LAB_0013355a;
                    }
                  }
                }
              }
            }
            break;
          }
          lVar4 = lVar4 + 0xc;
        } while ((ulong)(uint)((int)local_48 * 4) * 3 != lVar4);
      }
      uVar13 = 0;
      uVar14 = 0;
      goto LAB_0013346c;
    }
  }
  rVar10.offset = 0;
  rVar10.size = 0;
  return rVar10;
  while( true ) {
    lVar4 = lVar4 + 0xc;
    uVar13 = 0;
    if ((ulong)(uint)((int)local_48 << 2) * 3 == lVar4) break;
LAB_0013355a:
    uVar1 = *(uint *)((long)puVar11 + lVar4 + 4);
    if ((uVar1 <= uVar12) && (uVar12 < uVar1 + *(int *)((long)puVar11 + lVar4))) {
      uVar12 = (uVar12 - uVar1) + *(int *)((long)puVar11 + lVar4 + 8);
      uVar13 = (ulong)uVar12;
      uVar14 = 0;
      if (uVar12 != 0) {
        uVar14 = (ulong)local_54 << 0x20;
      }
      break;
    }
  }
LAB_0013346c:
  operator_delete(puVar11,local_50);
  return (resource)(uVar14 | uVar13);
}

Assistant:

pe_reader::resource pe_reader::find_resource(std::istream & is, boost::uint32_t name,
                                             boost::uint32_t type,
                                             boost::uint32_t language) {
	
	resource result;
	result.offset = result.size = 0;
	
	header coff;
	if(!coff.load(is)) {
		return result;
	}
	
	section_table sections;
	if(!sections.load(is, coff)) {
		return result;
	}
	
	boost::uint32_t resource_offset = sections.to_file_offset(coff.resource_table_address);
	if(!resource_offset) {
		return result;
	}
	
	is.seekg(resource_offset);
	boost::uint32_t type_offset = find_resource_entry(is, type);
	if(!get_resource_table(type_offset, resource_offset)) {
		return result;
	}
	
	is.seekg(type_offset);
	boost::uint32_t name_offset = find_resource_entry(is, name);
	if(!get_resource_table(name_offset, resource_offset)) {
		return result;
	}
	
	is.seekg(name_offset);
	boost::uint32_t leaf_offset = find_resource_entry(is, language);
	if(!leaf_offset || get_resource_table(leaf_offset, resource_offset)) {
		return result;
	}
	
	// Virtual memory address and size of the resource data.
	is.seekg(leaf_offset);
	boost::uint32_t data_address = util::load<boost::uint32_t>(is);
	boost::uint32_t data_size = util::load<boost::uint32_t>(is);
	// ignore codepage and reserved word
	if(is.fail()) {
		return result;
	}
	
	boost::uint32_t data_offset = sections.to_file_offset(data_address);
	if(!data_offset) {
		return result;
	}
	
	result.offset = data_offset;
	result.size = data_size;
	
	return result;
}